

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O3

void __thiscall
CCIT<TTA>::PerformLabelingMem
          (CCIT<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  ulong uVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  Mat1b *pMVar6;
  long lVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  pointer piVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  uint uVar13;
  uint u;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  int iVar19;
  long lVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint v;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  bool bVar42;
  double dVar43;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  ulong local_358;
  long local_328;
  long local_2c8;
  long local_2b8;
  undefined1 local_2b0 [104];
  Mat local_248 [16];
  long local_238;
  long *local_200;
  long local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1e0;
  undefined1 local_1d8 [104];
  Mat local_170 [16];
  long local_160;
  long *local_128;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1d8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2b0,&local_110,0);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar6->field_0xc;
  lVar34 = (long)iVar4;
  uVar5 = *(uint *)&pMVar6->field_0x8;
  uVar15 = (ulong)uVar5;
  if (0 < lVar34) {
    iVar24 = 0;
    do {
      lVar25 = (long)iVar24;
      piVar21 = (int *)(local_160 + lVar25 * 4);
      *piVar21 = *piVar21 + 1;
      if (*(char *)(local_1d8._24_8_ + lVar25) == '\0') {
        iVar19 = iVar24 + 1;
        if ((iVar19 < iVar4) &&
           (piVar21 = (int *)(local_160 + 4 + lVar25 * 4), *piVar21 = *piVar21 + 1,
           *(char *)(local_1d8._24_8_ + 1 + lVar25) != '\0')) {
LAB_001dc3f3:
          uVar13 = TTA::MemNewLabel();
          piVar21 = (int *)(local_238 + lVar25 * 4);
          *piVar21 = *piVar21 + 1;
          *(uint *)(local_2b0._24_8_ + lVar25 * 4) = uVar13;
          goto LAB_001dc414;
        }
        if (1 < (int)uVar5) {
          lVar37 = *local_128;
          piVar21 = (int *)(local_160 + lVar37 + lVar25 * 4);
          *piVar21 = *piVar21 + 1;
          lVar17 = *(long *)local_1d8._80_8_;
          if (*(char *)(lVar25 + local_1d8._24_8_ + lVar17) == '\0') {
            if ((iVar19 < iVar4) &&
               (piVar21 = (int *)(local_160 + lVar37 + 4 + lVar25 * 4), *piVar21 = *piVar21 + 1,
               *(char *)(local_1d8._24_8_ + lVar17 + 1 + lVar25) != '\0')) goto LAB_001dc3f3;
          }
          else {
            uVar13 = TTA::MemNewLabel();
            piVar21 = (int *)(local_238 + lVar25 * 4);
            *piVar21 = *piVar21 + 1;
            *(uint *)(local_2b0._24_8_ + lVar25 * 4) = uVar13;
            if (iVar19 < iVar4) {
              piVar21 = (int *)(local_160 + *local_128 + 4 + lVar25 * 4);
              *piVar21 = *piVar21 + 1;
              cVar3 = *(char *)(lVar25 + 1 + local_1d8._24_8_ + *(long *)local_1d8._80_8_);
              goto joined_r0x001dc62f;
            }
          }
        }
LAB_001dc659:
        uVar38 = (ulong)(iVar24 + 2);
      }
      else {
        uVar13 = TTA::MemNewLabel();
        piVar21 = (int *)(local_238 + lVar25 * 4);
        *piVar21 = *piVar21 + 1;
        *(uint *)(local_2b0._24_8_ + lVar25 * 4) = uVar13;
        if (iVar4 <= iVar24 + 1) goto LAB_001dc659;
        piVar21 = (int *)(local_160 + 4 + lVar25 * 4);
        *piVar21 = *piVar21 + 1;
        if (*(char *)(local_1d8._24_8_ + 1 + lVar25) == '\0') {
          if (1 < (int)uVar5) {
            piVar21 = (int *)(local_160 + *local_128 + 4 + lVar25 * 4);
            *piVar21 = *piVar21 + 1;
            cVar3 = *(char *)(lVar25 + 1 + local_1d8._24_8_ + *(long *)local_1d8._80_8_);
joined_r0x001dc62f:
            if (cVar3 != '\0') goto LAB_001dc414;
          }
          goto LAB_001dc659;
        }
LAB_001dc414:
        uVar38 = lVar25 + 2;
        if ((int)uVar38 < iVar4) {
          lVar25 = uVar38 * 4;
          lVar37 = 0;
          do {
            piVar21 = (int *)(local_160 + lVar25 + lVar37 * 4);
            *piVar21 = *piVar21 + 1;
            if (*(char *)(lVar37 + local_1d8._24_8_ + uVar38) == '\0') {
              iVar19 = iVar24 + 3 + (int)lVar37;
              if ((iVar19 < iVar4) &&
                 (piVar21 = (int *)(local_160 + (long)iVar19 * 4), *piVar21 = *piVar21 + 1,
                 *(char *)(local_1d8._24_8_ + (long)iVar19) != '\0')) {
                if (((int)uVar5 < 2) ||
                   (piVar21 = (int *)(local_160 + *local_128 + lVar25 + lVar37 * 4),
                   *piVar21 = *piVar21 + 1,
                   *(char *)(lVar37 + local_1d8._24_8_ + *(long *)local_1d8._80_8_ + uVar38) == '\0'
                   )) {
LAB_001dc581:
                  uVar13 = TTA::MemNewLabel();
                }
                piVar21 = (int *)(local_238 + lVar25 + lVar37 * 4);
                *piVar21 = *piVar21 + 1;
                *(uint *)(local_2b0._24_8_ + lVar25 + lVar37 * 4) = uVar13;
                goto LAB_001dc5a4;
              }
              if (1 < (int)uVar5) {
                lVar20 = local_160 + *local_128;
                piVar21 = (int *)(lVar20 + lVar25 + lVar37 * 4);
                *piVar21 = *piVar21 + 1;
                lVar17 = local_1d8._24_8_ + *(long *)local_1d8._80_8_;
                if (*(char *)(lVar37 + lVar17 + uVar38) == '\0') {
                  if ((iVar19 < iVar4) &&
                     (piVar21 = (int *)(lVar20 + (long)iVar19 * 4), *piVar21 = *piVar21 + 1,
                     *(char *)(lVar17 + iVar19) != '\0')) goto LAB_001dc581;
                }
                else {
                  piVar21 = (int *)(local_238 + lVar25 + lVar37 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(local_2b0._24_8_ + lVar25 + lVar37 * 4) = uVar13;
                  if (iVar19 < iVar4) {
                    piVar21 = (int *)(lVar20 + (long)iVar19 * 4);
                    *piVar21 = *piVar21 + 1;
                    cVar3 = *(char *)(lVar17 + iVar19);
                    goto joined_r0x001dc4bc;
                  }
                }
              }
LAB_001dc637:
              uVar38 = uVar38 + lVar37 + 2;
              goto LAB_001dc660;
            }
            piVar21 = (int *)(local_238 + lVar25 + lVar37 * 4);
            *piVar21 = *piVar21 + 1;
            *(uint *)(local_2b0._24_8_ + lVar25 + lVar37 * 4) = uVar13;
            iVar19 = iVar24 + 3 + (int)lVar37;
            if (iVar4 <= iVar19) goto LAB_001dc637;
            lVar17 = (long)iVar19;
            piVar21 = (int *)(local_160 + lVar17 * 4);
            *piVar21 = *piVar21 + 1;
            if (*(char *)(local_1d8._24_8_ + lVar17) == '\0') {
              if (1 < (int)uVar5) {
                piVar21 = (int *)(local_160 + *local_128 + lVar17 * 4);
                *piVar21 = *piVar21 + 1;
                cVar3 = *(char *)(lVar17 + local_1d8._24_8_ + *(long *)local_1d8._80_8_);
joined_r0x001dc4bc:
                if (cVar3 != '\0') goto LAB_001dc5a4;
              }
              goto LAB_001dc637;
            }
LAB_001dc5a4:
            lVar17 = uVar38 + lVar37;
            lVar37 = lVar37 + 2;
          } while (lVar17 + 2 < lVar34);
          uVar38 = uVar38 + lVar37;
        }
      }
LAB_001dc660:
      iVar24 = (int)uVar38;
    } while (iVar24 < iVar4);
  }
  local_1e0 = accesses;
  if (2 < (int)uVar5) {
    uVar38 = 2;
    local_1e8 = 3;
    local_2c8 = 1;
    local_328 = 0;
    do {
      if (0 < iVar4) {
        lVar25 = uVar38 - 1;
        lVar37 = uVar38 - 2;
        uVar16 = uVar38 | 1;
        uVar26 = 0;
        do {
          lVar17 = *local_128;
          lVar29 = lVar17 * uVar38 + local_160;
          iVar24 = (int)uVar26;
          lVar40 = (long)iVar24;
          piVar21 = (int *)(lVar29 + lVar40 * 4);
          *piVar21 = *piVar21 + 1;
          lVar20 = *(long *)local_1d8._80_8_;
          lVar31 = lVar20 * uVar38 + local_1d8._24_8_;
          uVar13 = iVar24 + 1;
          if (*(char *)(lVar40 + lVar31) == '\0') {
            if (((int)uVar13 < iVar4) &&
               (piVar21 = (int *)(lVar29 + 4 + lVar40 * 4), *piVar21 = *piVar21 + 1,
               *(char *)(lVar31 + 1 + lVar40) != '\0')) {
              lVar17 = local_160 + lVar17 * lVar25;
              piVar21 = (int *)(lVar17 + 4 + lVar40 * 4);
              *piVar21 = *piVar21 + 1;
              lVar20 = local_1d8._24_8_ + lVar20 * lVar25;
              if (*(char *)(lVar40 + 1 + lVar20) == '\0') {
                piVar21 = (int *)(lVar17 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                if (*(char *)(lVar20 + lVar40) != '\0') {
                  lVar29 = *local_200;
                  lVar22 = lVar29 * lVar37 + local_238;
                  piVar21 = (int *)(lVar22 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar31 = *(long *)local_2b0._80_8_;
                  lVar28 = lVar31 * lVar37 + local_2b0._24_8_;
                  u = *(uint *)(lVar28 + lVar40 * 4);
                  piVar21 = (int *)(lVar29 * uVar38 + local_238 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(lVar31 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                  goto joined_r0x001dcd10;
                }
LAB_001dcdf2:
                if ((iVar24 + 2 < iVar4) &&
                   (piVar21 = (int *)(lVar17 + 8 + lVar40 * 4), *piVar21 = *piVar21 + 1,
                   *(char *)(lVar20 + 2 + lVar40) != '\0')) {
                  lVar17 = *local_200;
                  piVar21 = (int *)(lVar17 * lVar37 + local_238 + 8 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar20 = *(long *)local_2b0._80_8_;
                  u = *(uint *)(lVar20 * lVar37 + local_2b0._24_8_ + 8 + lVar40 * 4);
                  goto LAB_001dc8f7;
                }
LAB_001dce56:
                u = TTA::MemNewLabel();
                piVar21 = (int *)(*local_200 * uVar38 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                *(uint *)(*(long *)local_2b0._80_8_ * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
              }
              else {
                lVar17 = *local_200;
                piVar21 = (int *)(lVar17 * lVar37 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                lVar20 = *(long *)local_2b0._80_8_;
                u = *(uint *)(lVar20 * lVar37 + local_2b0._24_8_ + lVar40 * 4);
LAB_001dc8f7:
                piVar21 = (int *)(lVar17 * uVar38 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                *(uint *)(lVar20 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
              }
LAB_001dcea0:
              bVar42 = true;
              goto LAB_001dcea2;
            }
            if (uVar16 < uVar15) {
              lVar17 = local_160 + lVar17 * uVar16;
              piVar21 = (int *)(lVar17 + lVar40 * 4);
              *piVar21 = *piVar21 + 1;
              lVar20 = local_1d8._24_8_ + lVar20 * uVar16;
              if (*(char *)(lVar40 + lVar20) == '\0') {
                if (((int)uVar13 < iVar4) &&
                   (piVar21 = (int *)(lVar17 + 4 + lVar40 * 4), *piVar21 = *piVar21 + 1,
                   *(char *)(lVar20 + 1 + lVar40) != '\0')) goto LAB_001dce56;
              }
              else {
                u = TTA::MemNewLabel();
                piVar21 = (int *)(*local_200 * uVar38 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                *(uint *)(*(long *)local_2b0._80_8_ * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                if (((int)uVar13 < iVar4) &&
                   (piVar21 = (int *)(*local_128 * uVar16 + local_160 + 4 + lVar40 * 4),
                   *piVar21 = *piVar21 + 1,
                   *(char *)(lVar40 + 1 + *(long *)local_1d8._80_8_ * uVar16 + local_1d8._24_8_) !=
                   '\0')) goto LAB_001dcea0;
              }
            }
LAB_001dcc88:
            uVar27 = (ulong)(iVar24 + 2);
          }
          else {
            if (((int)uVar13 < iVar4) &&
               (piVar21 = (int *)(lVar29 + 4 + lVar40 * 4), *piVar21 = *piVar21 + 1,
               *(char *)(lVar31 + 1 + lVar40) != '\0')) {
              lVar17 = local_160 + lVar17 * lVar25;
              piVar21 = (int *)(lVar17 + lVar40 * 4);
              *piVar21 = *piVar21 + 1;
              lVar20 = local_1d8._24_8_ + lVar20 * lVar25;
              if (*(char *)(lVar40 + lVar20) == '\0') {
                piVar21 = (int *)(lVar17 + 4 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                if (*(char *)(lVar20 + 1 + lVar40) != '\0') {
                  lVar29 = *local_200;
                  lVar22 = lVar29 * lVar37 + local_238;
                  piVar21 = (int *)(lVar22 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar31 = *(long *)local_2b0._80_8_;
                  lVar28 = lVar31 * lVar37 + local_2b0._24_8_;
                  u = *(uint *)(lVar28 + lVar40 * 4);
                  piVar21 = (int *)(lVar29 * uVar38 + local_238 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(lVar31 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                  if ((1 < iVar24) &&
                     (piVar21 = (int *)(lVar17 + (ulong)(iVar24 - 1) * 4), *piVar21 = *piVar21 + 1,
                     *(char *)(lVar20 + (ulong)(iVar24 - 1)) != '\0')) {
                    piVar21 = (int *)(lVar22 + (ulong)(iVar24 - 2) * 4);
                    *piVar21 = *piVar21 + 1;
                    TTA::MemMerge(u,*(uint *)(lVar28 + (ulong)(iVar24 - 2) * 4));
                  }
                  goto LAB_001dcc65;
                }
                if ((iVar24 < 2) ||
                   (piVar21 = (int *)(lVar17 + (ulong)(iVar24 - 1) * 4), *piVar21 = *piVar21 + 1,
                   *(char *)(lVar20 + (ulong)(iVar24 - 1)) == '\0')) goto LAB_001dcdf2;
                lVar29 = *local_200;
                lVar22 = lVar29 * lVar37 + local_238;
                piVar21 = (int *)(lVar22 + (ulong)(iVar24 - 2) * 4);
                *piVar21 = *piVar21 + 1;
                lVar31 = *(long *)local_2b0._80_8_;
                lVar28 = lVar31 * lVar37 + local_2b0._24_8_;
                u = *(uint *)(lVar28 + (ulong)(iVar24 - 2) * 4);
                piVar21 = (int *)(lVar29 * uVar38 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                *(uint *)(lVar31 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                if (iVar24 + 2 < iVar4) {
                  uVar27 = uVar26 & 0xffffffff;
                  piVar21 = (int *)(lVar17 + 8 + uVar27 * 4);
                  *piVar21 = *piVar21 + 1;
                  if (*(char *)(lVar20 + 2 + uVar27) != '\0') {
                    piVar21 = (int *)(lVar22 + 8 + uVar27 * 4);
                    *piVar21 = *piVar21 + 1;
                    uVar13 = *(uint *)(lVar28 + 8 + uVar27 * 4);
                    goto LAB_001dcd2c;
                  }
                }
              }
              else {
                lVar29 = *local_200;
                lVar22 = lVar29 * lVar37 + local_238;
                piVar21 = (int *)(lVar22 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                lVar31 = *(long *)local_2b0._80_8_;
                lVar28 = lVar31 * lVar37 + local_2b0._24_8_;
                u = *(uint *)(lVar28 + lVar40 * 4);
                piVar21 = (int *)(lVar29 * uVar38 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                *(uint *)(lVar31 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                piVar21 = (int *)(lVar17 + 4 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                if (*(char *)(lVar20 + 1 + lVar40) != '\0') {
LAB_001dcc65:
                  bVar42 = true;
                  goto LAB_001dcea2;
                }
joined_r0x001dcd10:
                if ((iVar24 + 2 < iVar4) &&
                   (piVar21 = (int *)(lVar17 + 8 + lVar40 * 4), *piVar21 = *piVar21 + 1,
                   *(char *)(lVar20 + 2 + lVar40) != '\0')) {
                  piVar21 = (int *)(lVar22 + 8 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  uVar13 = *(uint *)(lVar28 + 8 + lVar40 * 4);
LAB_001dcd2c:
                  TTA::MemMerge(u,uVar13);
                }
              }
              bVar42 = true;
            }
            else {
              lVar17 = local_160 + lVar17 * lVar25;
              piVar21 = (int *)(lVar17 + lVar40 * 4);
              *piVar21 = *piVar21 + 1;
              lVar20 = local_1d8._24_8_ + lVar20 * lVar25;
              if (*(char *)(lVar40 + lVar20) == '\0') {
                if ((iVar24 < 2) ||
                   (piVar21 = (int *)(lVar17 + (ulong)(iVar24 - 1) * 4), *piVar21 = *piVar21 + 1,
                   *(char *)(lVar20 + (ulong)(iVar24 - 1)) == '\0')) {
                  if ((iVar4 <= (int)uVar13) ||
                     (piVar21 = (int *)(lVar17 + 4 + lVar40 * 4), *piVar21 = *piVar21 + 1,
                     *(char *)(lVar20 + 1 + lVar40) == '\0')) {
                    u = TTA::MemNewLabel();
                    piVar21 = (int *)(*local_200 * uVar38 + local_238 + lVar40 * 4);
                    *piVar21 = *piVar21 + 1;
                    lVar17 = *(long *)local_2b0._80_8_;
                    goto LAB_001dcb59;
                  }
                  lVar17 = *local_200;
                  piVar21 = (int *)(lVar17 * lVar37 + local_238 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar20 = *(long *)local_2b0._80_8_;
                  u = *(uint *)(lVar20 * lVar37 + local_2b0._24_8_ + lVar40 * 4);
                  piVar21 = (int *)(lVar17 * uVar38 + local_238 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(lVar20 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                }
                else {
                  lVar29 = *local_200;
                  lVar22 = lVar29 * lVar37 + local_238;
                  piVar21 = (int *)(lVar22 + (ulong)(iVar24 - 2) * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar31 = *(long *)local_2b0._80_8_;
                  lVar28 = lVar31 * lVar37 + local_2b0._24_8_;
                  u = *(uint *)(lVar28 + (ulong)(iVar24 - 2) * 4);
                  piVar21 = (int *)(lVar29 * uVar38 + local_238 + lVar40 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(lVar31 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                  if (iVar4 <= (int)uVar13) goto LAB_001dcc88;
                  piVar21 = (int *)(lVar17 + (ulong)uVar13 * 4);
                  *piVar21 = *piVar21 + 1;
                  if (*(char *)(lVar20 + (ulong)uVar13) != '\0') {
                    piVar21 = (int *)(lVar22 + lVar40 * 4);
                    *piVar21 = *piVar21 + 1;
                    TTA::MemMerge(u,*(uint *)(lVar28 + lVar40 * 4));
                  }
                }
              }
              else {
                lVar20 = *local_200;
                piVar21 = (int *)(lVar20 * lVar37 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
                lVar17 = *(long *)local_2b0._80_8_;
                u = *(uint *)(lVar17 * lVar37 + local_2b0._24_8_ + lVar40 * 4);
                piVar21 = (int *)(lVar20 * uVar38 + local_238 + lVar40 * 4);
                *piVar21 = *piVar21 + 1;
LAB_001dcb59:
                *(uint *)(lVar17 * uVar38 + local_2b0._24_8_ + lVar40 * 4) = u;
                if (iVar4 <= (int)uVar13) goto LAB_001dcc88;
              }
              if (uVar15 <= uVar16) goto LAB_001dcc88;
              piVar21 = (int *)(*local_128 * uVar16 + local_160 + 4 + lVar40 * 4);
              *piVar21 = *piVar21 + 1;
              bVar42 = *(char *)(lVar40 + 1 + *(long *)local_1d8._80_8_ * uVar16 + local_1d8._24_8_)
                       != '\0';
            }
LAB_001dcea2:
            uVar13 = iVar24 + 2;
            uVar27 = (ulong)uVar13;
            if ((bVar42) && ((int)uVar13 < iVar4)) {
              lVar20 = (long)(int)uVar13;
              lVar17 = lVar20 * 4;
              local_2b8 = 0;
              lVar29 = 0;
              do {
                uVar41 = lVar20 + lVar29;
                lVar31 = *local_128;
                lVar28 = lVar31 * uVar38 + local_160;
                piVar21 = (int *)(lVar28 + lVar17 + lVar29 * 4);
                *piVar21 = *piVar21 + 1;
                lVar40 = *(long *)local_1d8._80_8_;
                lVar22 = lVar40 * uVar38 + local_1d8._24_8_;
                uVar27 = (uVar26 & 0xffffffff) + 3 + lVar29;
                iVar14 = (int)uVar27;
                iVar19 = (int)lVar29;
                if (*(char *)(uVar41 + lVar22) != '\0') {
                  uVar1 = (uVar26 & 0xffffffff) + lVar29;
                  lVar7 = *local_200;
                  lVar23 = local_238 + lVar17;
                  lVar32 = uVar38 * lVar7 + lVar23;
                  piVar21 = (int *)(lVar32 + lVar29 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar36 = *(long *)local_2b0._80_8_;
                  lVar33 = local_2b0._24_8_ + lVar17;
                  lVar35 = uVar38 * lVar36 + lVar33;
                  *(uint *)(lVar35 + lVar29 * 4) = u;
                  iVar30 = (int)uVar1;
                  if (iVar14 < iVar4) {
                    lVar39 = (long)iVar14;
                    piVar21 = (int *)(lVar28 + lVar39 * 4);
                    *piVar21 = *piVar21 + 1;
                    if (*(char *)(lVar22 + lVar39) != '\0') {
                      lVar22 = lVar31 * lVar25 + local_160;
                      piVar21 = (int *)(local_160 + lVar17 + local_2c8 * lVar31 + lVar29 * 4);
                      *piVar21 = *piVar21 + 1;
                      lVar31 = lVar40 * lVar25 + local_1d8._24_8_;
                      cVar3 = *(char *)(lVar29 + local_1d8._24_8_ + lVar20 + local_2c8 * lVar40);
                      piVar21 = (int *)(lVar22 + lVar39 * 4);
                      *piVar21 = *piVar21 + 1;
                      if (cVar3 == '\0') {
                        if (*(char *)(lVar39 + lVar31) == '\0') {
                          if ((iVar30 < 0) ||
                             (uVar27 = (ulong)(iVar24 + iVar19 + 1),
                             piVar21 = (int *)(lVar22 + uVar27 * 4), *piVar21 = *piVar21 + 1,
                             *(char *)(lVar31 + uVar27) == '\0')) {
                            iVar19 = iVar24 + iVar19 + 4;
                            if (iVar19 < iVar4) {
                              lVar40 = (long)iVar19;
                              piVar21 = (int *)(lVar22 + lVar40 * 4);
                              *piVar21 = *piVar21 + 1;
                              if (*(char *)(lVar31 + lVar40) == '\0') goto LAB_001ddb62;
                              piVar21 = (int *)(local_238 + lVar7 * lVar37 + lVar40 * 4);
                              *piVar21 = *piVar21 + 1;
                              uVar13 = *(uint *)(local_2b0._24_8_ + lVar36 * lVar37 + lVar40 * 4);
                              goto LAB_001ddb50;
                            }
                            goto LAB_001ddb62;
                          }
                          uVar13 = iVar24 + iVar19 + 4;
                          if ((int)uVar13 < iVar4) {
                            uVar27 = (ulong)uVar13;
                            piVar21 = (int *)(lVar22 + uVar27 * 4);
                            *piVar21 = *piVar21 + 1;
                            if (*(char *)(lVar31 + uVar27) != '\0') {
                              lVar22 = local_238 + lVar7 * lVar37;
                              lVar31 = (uVar1 & 0xffffffff) * 4;
                              piVar21 = (int *)(lVar31 + lVar22);
                              *piVar21 = *piVar21 + 1;
                              lVar40 = local_2b0._24_8_ + lVar36 * lVar37;
                              uVar13 = *(uint *)(lVar31 + lVar40);
                              piVar21 = (int *)(lVar22 + uVar27 * 4);
                              *piVar21 = *piVar21 + 1;
                              v = *(uint *)(lVar40 + uVar27 * 4);
                              goto LAB_001dd6cc;
                            }
                          }
                          lVar31 = (uVar1 & 0xffffffff) * 4;
                          piVar21 = (int *)(lVar31 + local_238 + lVar7 * lVar37);
                          *piVar21 = *piVar21 + 1;
                          uVar13 = *(uint *)(lVar31 + local_2b0._24_8_ + lVar36 * lVar37);
                        }
                        else {
                          if ((iVar30 < 0) ||
                             (uVar27 = (ulong)(iVar24 + iVar19 + 1),
                             piVar21 = (int *)(lVar22 + uVar27 * 4), *piVar21 = *piVar21 + 1,
                             *(char *)(lVar31 + uVar27) == '\0')) goto LAB_001dd6d7;
                          lVar31 = (uVar1 & 0xffffffff) * 4;
                          piVar21 = (int *)(lVar31 + local_238 + lVar7 * lVar37);
                          *piVar21 = *piVar21 + 1;
                          uVar13 = *(uint *)(lVar31 + local_2b0._24_8_ + lVar36 * lVar37);
                          piVar21 = (int *)(lVar23 + local_328 * lVar7 + lVar29 * 4);
                          *piVar21 = *piVar21 + 1;
                          v = *(uint *)(lVar33 + local_328 * lVar36 + lVar29 * 4);
LAB_001dd6cc:
                          uVar13 = TTA::MemMerge(uVar13,v);
                        }
                      }
                      else {
                        if (*(char *)(lVar39 + lVar31) != '\0') {
                          piVar21 = (int *)(lVar23 + lVar7 * local_328 + lVar29 * 4);
                          *piVar21 = *piVar21 + 1;
                          TTA::MemMerge(u,*(uint *)(lVar33 + lVar36 * local_328 + lVar29 * 4));
                          goto LAB_001ddb62;
                        }
                        iVar19 = iVar24 + iVar19 + 4;
                        if (iVar19 < iVar4) {
                          lVar40 = (long)iVar19;
                          piVar21 = (int *)(lVar22 + lVar40 * 4);
                          *piVar21 = *piVar21 + 1;
                          if (*(char *)(lVar31 + lVar40) != '\0') {
                            piVar21 = (int *)(lVar23 + local_328 * lVar7 + lVar29 * 4);
                            *piVar21 = *piVar21 + 1;
                            uVar13 = *(uint *)(lVar33 + local_328 * lVar36 + lVar29 * 4);
                            piVar21 = (int *)(local_238 + lVar7 * lVar37 + lVar40 * 4);
                            *piVar21 = *piVar21 + 1;
                            v = *(uint *)(local_2b0._24_8_ + lVar36 * lVar37 + lVar40 * 4);
                            goto LAB_001dd6cc;
                          }
                        }
LAB_001dd6d7:
                        piVar21 = (int *)(lVar23 + lVar7 * local_328 + lVar29 * 4);
                        *piVar21 = *piVar21 + 1;
                        uVar13 = *(uint *)(lVar33 + lVar36 * local_328 + lVar29 * 4);
                      }
                      TTA::MemMerge(u,uVar13);
                      goto LAB_001ddb62;
                    }
                  }
                  piVar21 = (int *)(lVar32 + lVar29 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(lVar35 + lVar29 * 4) = u;
                  piVar21 = (int *)(local_2c8 * lVar31 + lVar17 + local_160 + lVar29 * 4);
                  *piVar21 = *piVar21 + 1;
                  if (*(char *)(lVar29 + local_2c8 * lVar40 + lVar20 + local_1d8._24_8_) == '\0') {
                    lVar22 = local_160 + lVar31 * lVar25;
                    lVar31 = local_1d8._24_8_ + lVar40 * lVar25;
                    if ((iVar30 < 0) ||
                       (uVar41 = (ulong)(iVar24 + iVar19 + 1),
                       piVar21 = (int *)(lVar22 + uVar41 * 4), *piVar21 = *piVar21 + 1,
                       *(char *)(lVar31 + uVar41) == '\0')) {
                      if (iVar4 <= iVar14) goto LAB_001ddb92;
                      piVar21 = (int *)(lVar22 + (long)iVar14 * 4);
                      *piVar21 = *piVar21 + 1;
                      if (*(char *)(lVar31 + iVar14) != '\0') {
                        piVar21 = (int *)(lVar23 + lVar7 * local_328 + lVar29 * 4);
                        *piVar21 = *piVar21 + 1;
                        uVar13 = *(uint *)(lVar33 + lVar36 * local_328 + lVar29 * 4);
                        goto LAB_001dd430;
                      }
                    }
                    else {
                      if ((iVar4 <= iVar14) ||
                         (uVar27 = uVar27 & 0xffffffff, piVar21 = (int *)(lVar22 + uVar27 * 4),
                         *piVar21 = *piVar21 + 1, *(char *)(lVar31 + uVar27) == '\0')) {
                        uVar41 = uVar1 & 0xffffffff;
                        piVar21 = (int *)(local_238 + lVar7 * lVar37 + uVar41 * 4);
                        goto LAB_001dd10c;
                      }
                      lVar31 = (uVar1 & 0xffffffff) * 4;
                      piVar21 = (int *)(lVar31 + local_238 + lVar7 * lVar37);
                      *piVar21 = *piVar21 + 1;
                      uVar13 = *(uint *)(lVar31 + local_2b0._24_8_ + lVar36 * lVar37);
                      piVar21 = (int *)(lVar23 + local_328 * lVar7 + lVar29 * 4);
                      *piVar21 = *piVar21 + 1;
                      uVar13 = TTA::MemMerge(uVar13,*(uint *)(lVar33 + local_328 * lVar36 +
                                                             lVar29 * 4));
LAB_001dd430:
                      TTA::MemMerge(u,uVar13);
                    }
LAB_001dd446:
                    if (uVar16 < uVar15) {
                      piVar21 = (int *)(*local_128 * uVar16 + local_160 + (long)iVar14 * 4);
                      *piVar21 = *piVar21 + 1;
                      cVar3 = *(char *)((long)iVar14 +
                                       *(long *)local_1d8._80_8_ * uVar16 + local_1d8._24_8_);
joined_r0x001dd493:
                      if (cVar3 != '\0') goto LAB_001ddb62;
                    }
                  }
                  else {
                    piVar21 = (int *)(lVar23 + local_2b8 + lVar7 * local_328);
LAB_001dd10c:
                    *piVar21 = *piVar21 + 1;
                    TTA::MemMerge(u,*(uint *)(local_2b0._24_8_ + lVar36 * lVar37 + uVar41 * 4));
                    if (iVar14 < iVar4) goto LAB_001dd446;
                  }
LAB_001ddb92:
                  uVar27 = lVar20 + lVar29 + 2;
                  goto LAB_001ddb9e;
                }
                if (iVar4 <= iVar14) {
LAB_001dd25b:
                  if (uVar16 < uVar15) {
                    lVar22 = lVar31 * uVar16 + local_160;
                    piVar21 = (int *)(local_160 + lVar17 + local_1e8 * lVar31 + lVar29 * 4);
                    *piVar21 = *piVar21 + 1;
                    lVar31 = lVar40 * uVar16 + local_1d8._24_8_;
                    if (*(char *)(lVar29 + local_1d8._24_8_ + lVar20 + local_1e8 * lVar40) == '\0')
                    {
                      if ((iVar14 < iVar4) &&
                         (piVar21 = (int *)(lVar22 + (long)iVar14 * 4), *piVar21 = *piVar21 + 1,
                         *(char *)(lVar31 + iVar14) != '\0')) goto LAB_001dd4b7;
                    }
                    else {
                      piVar21 = (int *)(*local_200 * uVar38 + local_238 + lVar17 + lVar29 * 4);
                      *piVar21 = *piVar21 + 1;
                      *(uint *)(*(long *)local_2b0._80_8_ * uVar38 + local_2b0._24_8_ + lVar17 +
                               lVar29 * 4) = u;
                      if (iVar14 < iVar4) {
                        piVar21 = (int *)(lVar22 + (long)iVar14 * 4);
                        *piVar21 = *piVar21 + 1;
                        cVar3 = *(char *)(lVar31 + iVar14);
                        goto joined_r0x001dd493;
                      }
                    }
                  }
                  goto LAB_001ddb92;
                }
                lVar33 = (long)iVar14;
                piVar21 = (int *)(lVar28 + lVar33 * 4);
                *piVar21 = *piVar21 + 1;
                if (*(char *)(lVar22 + lVar33) == '\0') goto LAB_001dd25b;
                if (uVar16 < uVar15) {
                  piVar21 = (int *)(local_1e8 * lVar31 + local_160 + lVar17 + lVar29 * 4);
                  *piVar21 = *piVar21 + 1;
                  if (*(char *)(lVar29 + local_1e8 * lVar40 + local_1d8._24_8_ + lVar20) == '\0')
                  goto LAB_001dd511;
                  lVar28 = *local_200;
                  lVar22 = local_238 + lVar17;
                  piVar21 = (int *)(uVar38 * lVar28 + lVar22 + lVar29 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar7 = *(long *)local_2b0._80_8_;
                  lVar36 = lVar17 + local_2b0._24_8_;
                  *(uint *)(uVar38 * lVar7 + lVar36 + lVar29 * 4) = u;
                  lVar32 = local_160 + lVar31 * lVar25;
                  piVar21 = (int *)(lVar32 + lVar33 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar23 = local_1d8._24_8_ + lVar40 * lVar25;
                  if (*(char *)(lVar33 + lVar23) == '\0') {
                    piVar21 = (int *)(local_160 + lVar17 + lVar31 * local_2c8 + lVar29 * 4);
                    *piVar21 = *piVar21 + 1;
                    if (*(char *)(lVar29 + local_1d8._24_8_ + lVar20 + lVar40 * local_2c8) != '\0')
                    {
                      iVar14 = iVar24 + iVar19 + 4;
                      if (iVar14 < iVar4) {
                        lVar31 = (long)iVar14;
                        piVar21 = (int *)(lVar32 + lVar31 * 4);
                        *piVar21 = *piVar21 + 1;
                        if (*(char *)(lVar23 + lVar31) != '\0') {
                          piVar21 = (int *)(lVar22 + local_328 * lVar28 + lVar29 * 4);
                          *piVar21 = *piVar21 + 1;
                          uVar13 = *(uint *)(lVar36 + local_328 * lVar7 + lVar29 * 4);
                          piVar21 = (int *)(local_238 + lVar28 * lVar37 + lVar31 * 4);
                          *piVar21 = *piVar21 + 1;
                          uVar13 = TTA::MemMerge(uVar13,*(uint *)(local_2b0._24_8_ + lVar7 * lVar37
                                                                 + lVar31 * 4));
                          goto LAB_001ddab8;
                        }
                      }
                      piVar21 = (int *)(lVar22 + lVar28 * local_328 + lVar29 * 4);
                      *piVar21 = *piVar21 + 1;
                      uVar13 = *(uint *)(lVar36 + lVar7 * local_328 + lVar29 * 4);
                      goto LAB_001ddab8;
                    }
                  }
                  else {
                    piVar21 = (int *)(lVar22 + lVar28 * local_328 + lVar29 * 4);
                    *piVar21 = *piVar21 + 1;
                    uVar13 = *(uint *)(lVar36 + lVar7 * local_328 + lVar29 * 4);
LAB_001ddab8:
                    TTA::MemMerge(u,uVar13);
                  }
                  iVar19 = iVar24 + iVar19 + 4;
                  if (iVar19 < iVar4) {
                    lVar31 = (long)iVar19;
                    piVar21 = (int *)(*local_128 * lVar25 + local_160 + lVar31 * 4);
                    *piVar21 = *piVar21 + 1;
                    if (*(char *)(lVar31 + *(long *)local_1d8._80_8_ * lVar25 + local_1d8._24_8_) ==
                        '\0') goto LAB_001ddb62;
                    piVar21 = (int *)(*local_200 * lVar37 + local_238 + lVar31 * 4);
                    *piVar21 = *piVar21 + 1;
                    uVar13 = *(uint *)(*(long *)local_2b0._80_8_ * lVar37 + local_2b0._24_8_ +
                                      lVar31 * 4);
LAB_001ddb50:
                    TTA::MemMerge(u,uVar13);
                  }
                }
                else {
LAB_001dd511:
                  lVar28 = lVar31 * lVar25 + local_160;
                  piVar21 = (int *)(lVar28 + lVar33 * 4);
                  *piVar21 = *piVar21 + 1;
                  lVar22 = lVar40 * lVar25 + local_1d8._24_8_;
                  if (*(char *)(lVar33 + lVar22) != '\0') {
                    lVar31 = *local_200;
                    piVar21 = (int *)(local_328 * lVar31 + local_238 + lVar17 + lVar29 * 4);
                    *piVar21 = *piVar21 + 1;
                    lVar40 = *(long *)local_2b0._80_8_;
                    u = *(uint *)(local_328 * lVar40 + local_2b0._24_8_ + lVar17 + lVar29 * 4);
                    piVar21 = (int *)(lVar31 * uVar38 + local_238 + lVar17 + lVar29 * 4);
                    *piVar21 = *piVar21 + 1;
                    *(uint *)(lVar40 * uVar38 + local_2b0._24_8_ + lVar17 + lVar29 * 4) = u;
                    goto LAB_001ddb62;
                  }
                  piVar21 = (int *)(local_160 + lVar17 + lVar31 * local_2c8 + lVar29 * 4);
                  *piVar21 = *piVar21 + 1;
                  if (*(char *)(lVar29 + local_1d8._24_8_ + lVar20 + lVar40 * local_2c8) != '\0') {
                    lVar31 = *local_200;
                    piVar21 = (int *)(local_328 * lVar31 + local_238 + lVar17 + lVar29 * 4);
                    *piVar21 = *piVar21 + 1;
                    lVar40 = *(long *)local_2b0._80_8_;
                    u = *(uint *)(local_328 * lVar40 + local_2b0._24_8_ + lVar17 + lVar29 * 4);
                    piVar21 = (int *)(uVar38 * lVar31 + local_238 + lVar17 + lVar29 * 4);
                    *piVar21 = *piVar21 + 1;
                    *(uint *)(uVar38 * lVar40 + local_2b0._24_8_ + lVar17 + lVar29 * 4) = u;
                    iVar19 = iVar24 + iVar19 + 4;
                    if (iVar19 < iVar4) {
                      lVar33 = (long)iVar19;
                      piVar21 = (int *)(lVar28 + lVar33 * 4);
                      *piVar21 = *piVar21 + 1;
                      if (*(char *)(lVar22 + lVar33) != '\0') {
                        piVar21 = (int *)(local_238 + lVar31 * lVar37 + lVar33 * 4);
                        *piVar21 = *piVar21 + 1;
                        uVar13 = *(uint *)(local_2b0._24_8_ + lVar40 * lVar37 + lVar33 * 4);
                        goto LAB_001ddb50;
                      }
                    }
                    goto LAB_001ddb62;
                  }
                  iVar19 = iVar24 + iVar19 + 4;
                  if (iVar19 < iVar4) {
                    lVar31 = (long)iVar19;
                    piVar21 = (int *)(lVar28 + lVar31 * 4);
                    *piVar21 = *piVar21 + 1;
                    if (*(char *)(lVar22 + lVar31) != '\0') {
                      lVar40 = *local_200;
                      piVar21 = (int *)(lVar40 * lVar37 + local_238 + lVar31 * 4);
                      *piVar21 = *piVar21 + 1;
                      lVar22 = *(long *)local_2b0._80_8_;
                      u = *(uint *)(lVar22 * lVar37 + local_2b0._24_8_ + lVar31 * 4);
                      piVar21 = (int *)(local_238 + lVar17 + lVar40 * uVar38 + lVar29 * 4);
                      *piVar21 = *piVar21 + 1;
                      *(uint *)(local_2b0._24_8_ + lVar17 + lVar22 * uVar38 + lVar29 * 4) = u;
                      goto LAB_001ddb62;
                    }
                  }
LAB_001dd4b7:
                  u = TTA::MemNewLabel();
                  piVar21 = (int *)(*local_200 * uVar38 + local_238 + lVar17 + lVar29 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(*(long *)local_2b0._80_8_ * uVar38 + local_2b0._24_8_ + lVar17 +
                           lVar29 * 4) = u;
                }
LAB_001ddb62:
                lVar31 = lVar29 + 2;
                lVar29 = lVar29 + 2;
                local_2b8 = local_2b8 + 8;
              } while (lVar31 + lVar20 < lVar34);
              uVar27 = lVar20 + lVar29;
            }
          }
LAB_001ddb9e:
          uVar26 = uVar27;
        } while ((int)uVar27 < iVar4);
      }
      uVar38 = uVar38 + 2;
      local_1e8 = local_1e8 + 2;
      local_2c8 = local_2c8 + 2;
      local_328 = local_328 + 2;
    } while (uVar38 < uVar15);
  }
  uVar13 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
  if (0 < (int)uVar5) {
    lVar25 = 1;
    local_358 = 0;
    do {
      piVar11 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar10 = TTA::mem_rtable_.vec_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < iVar4) {
        uVar38 = local_358 | 1;
        lVar37 = *local_200;
        lVar17 = *(long *)local_2b0._80_8_;
        lVar20 = 1;
        do {
          piVar21 = (int *)(lVar37 * local_358 + local_238 + -4 + lVar20 * 4);
          *piVar21 = *piVar21 + 1;
          lVar29 = (long)*(int *)(lVar17 * local_358 + local_2b0._24_8_ + -4 + lVar20 * 4);
          if (lVar29 < 1) {
            lVar29 = *local_200;
            lVar40 = local_358 * lVar29 + local_238;
            piVar21 = (int *)(lVar40 + -4 + lVar20 * 4);
            *piVar21 = *piVar21 + 1;
            lVar31 = *(long *)local_2b0._80_8_;
            lVar22 = local_358 * lVar31 + local_2b0._24_8_;
            *(undefined4 *)(lVar22 + -4 + lVar20 * 4) = 0;
            if (lVar20 < lVar34) {
              piVar21 = (int *)(lVar40 + lVar20 * 4);
              *piVar21 = *piVar21 + 1;
              *(undefined4 *)(lVar22 + lVar20 * 4) = 0;
              if (uVar38 < uVar15) {
                lVar29 = lVar29 * lVar25 + local_238;
                piVar21 = (int *)(lVar29 + -4 + lVar20 * 4);
                *piVar21 = *piVar21 + 1;
                lVar31 = lVar31 * lVar25 + local_2b0._24_8_;
                *(undefined4 *)(lVar31 + -4 + lVar20 * 4) = 0;
                piVar21 = (int *)(lVar29 + lVar20 * 4);
                *piVar21 = *piVar21 + 1;
                *(undefined4 *)(lVar31 + lVar20 * 4) = 0;
              }
            }
            else if (uVar38 < uVar15) {
              piVar21 = (int *)(lVar29 * lVar25 + local_238 + -4 + lVar20 * 4);
              *piVar21 = *piVar21 + 1;
              *(undefined4 *)(lVar31 * lVar25 + local_2b0._24_8_ + -4 + lVar20 * 4) = 0;
            }
          }
          else {
            piVar11[lVar29] = piVar11[lVar29] + 1;
            uVar5 = puVar10[lVar29];
            lVar29 = *local_128;
            lVar33 = local_358 * lVar29 + local_160;
            piVar21 = (int *)(lVar33 + -4 + lVar20 * 4);
            *piVar21 = *piVar21 + 1;
            lVar31 = *(long *)local_1d8._80_8_;
            lVar22 = local_358 * lVar31 + local_1d8._24_8_;
            lVar40 = *local_200;
            lVar28 = local_358 * lVar40 + local_238;
            uVar13 = uVar5;
            if (*(char *)(lVar20 + -1 + lVar22) == '\0') {
              uVar13 = 0;
            }
            piVar21 = (int *)(lVar28 + -4 + lVar20 * 4);
            *piVar21 = *piVar21 + 1;
            lVar7 = *(long *)local_2b0._80_8_;
            lVar36 = local_358 * lVar7 + local_2b0._24_8_;
            *(uint *)(lVar36 + -4 + lVar20 * 4) = uVar13;
            if (lVar20 < lVar34) {
              piVar21 = (int *)(lVar33 + lVar20 * 4);
              *piVar21 = *piVar21 + 1;
              uVar13 = uVar5;
              if (*(char *)(lVar20 + lVar22) == '\0') {
                uVar13 = 0;
              }
              piVar21 = (int *)(lVar28 + lVar20 * 4);
              *piVar21 = *piVar21 + 1;
              *(uint *)(lVar36 + lVar20 * 4) = uVar13;
              if (uVar38 < uVar15) {
                piVar21 = (int *)(lVar29 * lVar25 + local_160 + -4 + lVar20 * 4);
                *piVar21 = *piVar21 + 1;
                uVar13 = uVar5;
                if (*(char *)(lVar20 + -1 + lVar31 * lVar25 + local_1d8._24_8_) == '\0') {
                  lVar40 = *local_200;
                  uVar13 = 0;
                }
                piVar21 = (int *)(lVar40 * lVar25 + local_238 + -4 + lVar20 * 4);
                *piVar21 = *piVar21 + 1;
                *(uint *)(*(long *)local_2b0._80_8_ * lVar25 + local_2b0._24_8_ + -4 + lVar20 * 4) =
                     uVar13;
                piVar21 = (int *)(*local_128 * lVar25 + local_160 + lVar20 * 4);
                *piVar21 = *piVar21 + 1;
                if (*(char *)(lVar20 + *(long *)local_1d8._80_8_ * lVar25 + local_1d8._24_8_) ==
                    '\0') {
                  piVar21 = (int *)(*local_200 * lVar25 + local_238 + lVar20 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(undefined4 *)
                   (*(long *)local_2b0._80_8_ * lVar25 + local_2b0._24_8_ + lVar20 * 4) = 0;
                }
                else {
                  piVar21 = (int *)(*local_200 * lVar25 + local_238 + lVar20 * 4);
                  *piVar21 = *piVar21 + 1;
                  *(uint *)(*(long *)local_2b0._80_8_ * lVar25 + local_2b0._24_8_ + lVar20 * 4) =
                       uVar5;
                }
              }
            }
            else if (uVar38 < uVar15) {
              piVar21 = (int *)(lVar29 * lVar25 + local_160 + -4 + lVar20 * 4);
              *piVar21 = *piVar21 + 1;
              cVar3 = *(char *)(lVar20 + -1 + lVar31 * lVar25 + local_1d8._24_8_);
              piVar21 = (int *)(lVar40 * lVar25 + local_238 + -4 + lVar20 * 4);
              *piVar21 = *piVar21 + 1;
              lVar29 = lVar7 * lVar25 + local_2b0._24_8_;
              if (cVar3 == '\0') {
                *(undefined4 *)(lVar29 + -4 + lVar20 * 4) = 0;
              }
              else {
                *(uint *)(lVar29 + -4 + lVar20 * 4) = uVar5;
              }
            }
          }
          lVar29 = lVar20 + 1;
          lVar20 = lVar20 + 2;
        } while (lVar29 < lVar34);
      }
      local_358 = local_358 + 2;
      lVar25 = lVar25 + 2;
    } while (local_358 < uVar15);
  }
  pauVar18 = (undefined1 (*) [16])operator_new(0x20);
  pvVar12 = local_1e0;
  pauVar18[1] = (undefined1  [16])0x0;
  *pauVar18 = (undefined1  [16])0x0;
  puVar8 = (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar18;
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar18 + 2);
  (local_1e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar18 + 2);
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)puVar9 - (long)puVar8);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_170;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_248;
  cv::sum((_InputArray *)&local_f0);
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_f0._0_8_ >> 0x3f & (long)((double)local_f0._0_8_ - 9.223372036854776e+18)
       | (long)(double)local_f0._0_8_;
  dVar43 = TTA::MemTotalAccesses();
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar43 >> 0x3f & (long)(dVar43 - 9.223372036854776e+18) | (long)dVar43;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_2b0);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_248);
  cv::Mat::~Mat((Mat *)(local_2b0 + 8));
  cv::Mat::~Mat(local_170);
  cv::Mat::~Mat((Mat *)(local_1d8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

        int lx, u, v, k;

#define CONDITION_B1 img(y, x) > 0 
#define CONDITION_B2 x+1<w && img(y, x+1) > 0                // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img(y + 1, x) > 0              // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img(y + 1, x + 1) > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img(y - 1, x - 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U2 img(y - 1, x) > 0
#define CONDITION_U3 x+1<w && img(y - 1, x + 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img(y - 1, x + 2) > 0          // WRONG in the original code -> add missing condition
#define ASSIGN_S  img_labels(y, x) = img_labels(y, x - 2)
#define ASSIGN_P  img_labels(y, x) = img_labels(y - 2, x - 2)
#define ASSIGN_Q  img_labels(y, x) = img_labels(y - 2, x)
#define ASSIGN_R  img_labels(y, x) = img_labels(y - 2, x + 2)
#define ASSIGN_LX img_labels(y, x) = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels(y - 2, x-2)
#define LOAD_PV v = img_labels(y - 2, x-2)
#define LOAD_QU u = img_labels(y - 2, x)
#define LOAD_QV v = img_labels(y - 2, x)
#define LOAD_QK k = img_labels(y - 2, x)
#define LOAD_RV v = img_labels(y - 2, x+2)
#define LOAD_RK k = img_labels(y - 2, x+2)
#define NEW_LABEL lx = img_labels(y, x) = LabelsSolver::MemNewLabel();
#define RESOLVE_2(u, v) LabelsSolver::MemMerge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::MemMerge(u,LabelsSolver::MemMerge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }